

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_renderbuffer_parameteriv
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18 [2];
  GLuint rbo;
  GLint params [1];
  NegativeTestContext *ctx_local;
  
  local_18[1] = 0xffffffff;
  _rbo = ctx;
  glu::CallLogWrapper::glGenRenderbuffers(&ctx->super_CallLogWrapper,1,local_18);
  glu::CallLogWrapper::glBindRenderbuffer(&_rbo->super_CallLogWrapper,0x8d41,local_18[0]);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.",
             &local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetRenderbufferParameteriv
            (&_rbo->super_CallLogWrapper,0xffffffff,0x8d42,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_rbo,0x500);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.",&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glGetRenderbufferParameteriv
            (&_rbo->super_CallLogWrapper,0x8d41,0xffffffff,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_rbo,0x500);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_OPERATION  is generated if the renderbuffer currently bound to target is zero."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glBindRenderbuffer(&_rbo->super_CallLogWrapper,0x8d41,0);
  NegativeTestContext::expectError(_rbo,0);
  glu::CallLogWrapper::glGetRenderbufferParameteriv
            (&_rbo->super_CallLogWrapper,0x8d41,0x8d42,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_rbo,0x502);
  NegativeTestContext::endSection(_rbo);
  glu::CallLogWrapper::glDeleteRenderbuffers(&_rbo->super_CallLogWrapper,1,local_18);
  glu::CallLogWrapper::glBindRenderbuffer(&_rbo->super_CallLogWrapper,0x8d41,0);
  return;
}

Assistant:

void get_renderbuffer_parameteriv (NegativeTestContext& ctx)
{
	GLint	params[1] = { -1 };
	GLuint	rbo;
	ctx.glGenRenderbuffers(1, &rbo);
	ctx.glBindRenderbuffer(GL_RENDERBUFFER, rbo);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.");
	ctx.glGetRenderbufferParameteriv(-1, GL_RENDERBUFFER_WIDTH, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.");
	ctx.glGetRenderbufferParameteriv(GL_RENDERBUFFER, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION  is generated if the renderbuffer currently bound to target is zero.");
	ctx.glBindRenderbuffer(GL_RENDERBUFFER, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_WIDTH, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteRenderbuffers(1, &rbo);
	ctx.glBindRenderbuffer(GL_RENDERBUFFER, 0);
}